

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLutility.c
# Opt level: O2

void RDL_print2DCharArray(char **arr,uint n,uint m)

{
  ulong uVar1;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 != n; uVar2 = uVar2 + 1) {
    for (uVar1 = 0; m != uVar1; uVar1 = uVar1 + 1) {
      printf("%d ",(ulong)(uint)(int)arr[uVar2][uVar1]);
    }
    putchar(10);
  }
  return;
}

Assistant:

void RDL_print2DCharArray(char **arr, unsigned n, unsigned m)
{
  unsigned i,j;
  for(i=0; i<n; ++i)
  {
    for(j=0; j<m; ++j)
    {
      printf("%d ",arr[i][j]);
    }
    printf("\n");
  }
}